

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsproxywidget.cpp
# Opt level: O0

void __thiscall
QGraphicsProxyWidget::hoverLeaveEvent(QGraphicsProxyWidget *this,QGraphicsSceneHoverEvent *event)

{
  long lVar1;
  bool bVar2;
  QWidget *this_00;
  long in_FS_OFFSET;
  QGraphicsProxyWidgetPrivate *d;
  QPointF *in_stack_000000c8;
  QWidget *in_stack_000000d0;
  QWidget *in_stack_000000d8;
  QWidget *in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QGraphicsProxyWidget *)0x9bce9a);
  bVar2 = ::QPointer::operator_cast_to_bool((QPointer<QWidget> *)0x9bceb0);
  if (bVar2) {
    this_00 = ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x9bcec7);
    QGraphicsSceneHoverEvent::screenPos((QGraphicsSceneHoverEvent *)this_00);
    QPointF::QPointF((QPointF *)this_00,(QPoint *)in_stack_ffffffffffffffb8);
    QApplicationPrivate::dispatchEnterLeave(in_stack_000000d8,in_stack_000000d0,in_stack_000000c8);
    QPointer<QWidget>::operator=((QPointer<QWidget> *)this_00,in_stack_ffffffffffffffb8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsProxyWidget::hoverLeaveEvent(QGraphicsSceneHoverEvent *event)
{
    Q_UNUSED(event);
    Q_D(QGraphicsProxyWidget);
    // If hoverMove was compressed away, make sure we update properly here.
    if (d->lastWidgetUnderMouse) {
        QApplicationPrivate::dispatchEnterLeave(nullptr, d->lastWidgetUnderMouse, event->screenPos());
        d->lastWidgetUnderMouse = nullptr;
    }
}